

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_server.c
# Opt level: O2

int main(void)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uStack_f90;
  mbedtls_net_context client_fd;
  mbedtls_net_context listen_fd;
  mbedtls_pk_context pkey;
  mbedtls_ssl_cache_context cache;
  char error_buf [100];
  mbedtls_ssl_config conf;
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_ssl_context ssl;
  mbedtls_x509_crt srvcert;
  mbedtls_entropy_context entropy;
  uchar buf [1024];
  
  mbedtls_net_init(&listen_fd);
  mbedtls_net_init(&client_fd);
  mbedtls_ssl_init(&ssl);
  mbedtls_ssl_config_init(&conf);
  mbedtls_ssl_cache_init(&cache);
  mbedtls_x509_crt_init(&srvcert);
  mbedtls_pk_init(&pkey);
  mbedtls_entropy_init(&entropy);
  mbedtls_ctr_drbg_init(&ctr_drbg);
  mbedtls_debug_set_threshold(0);
  printf("\n  . Loading the server cert. and key...");
  fflush(_stdout);
  uVar1 = mbedtls_x509_crt_parse(&srvcert,(uchar *)mbedtls_test_srv_crt,0x4ad);
  if ((uVar1 == 0) &&
     (uVar1 = mbedtls_x509_crt_parse
                        (&srvcert,(uchar *)
                                  "-----BEGIN CERTIFICATE-----\r\nMIIDhzCCAm+gAwIBAgIBADANBgkqhkiG9w0BAQUFADA7MQswCQYDVQQGEwJOTDER\r\nMA8GA1UEChMIUG9sYXJTU0wxGTAXBgNVBAMTEFBvbGFyU1NMIFRlc3QgQ0EwHhcN\r\nMTEwMjEyMTQ0NDAwWhcNMjEwMjEyMTQ0NDAwWjA7MQswCQYDVQQGEwJOTDERMA8G\r\nA1UEChMIUG9sYXJTU0wxGTAXBgNVBAMTEFBvbGFyU1NMIFRlc3QgQ0EwggEiMA0G\r\nCSqGSIb3DQEBAQUAA4IBDwAwggEKAoIBAQDA3zf8F7vglp0/ht6WMn1EpRagzSHx\r\nmdTs6st8GFgIlKXsm8WL3xoemTiZhx57wI053zhdcHgH057Zk+i5clHFzqMwUqny\r\n50BwFMtEonILwuVA+T7lpg6z+exKY8C4KQB0nFc7qKUEkHHxvYPZP9al4jwqj+8n\r\nYMPGn8u67GB9t+aEMr5P+1gmIgNb1LTV+/Xjli5wwOQuvfwu7uJBVcA0Ln0kcmnL\r\nR7EUQIN9Z/SG9jGr8XmksrUuEvmEF/Bibyc+E1ixVA0hmnM3oTDPb5Lc9un8rNsu\r\nKNF+AksjoBXyOGVkCeoMbo4bF6BxyLObyavpw/LPh5aPgAIynplYb6LVAgMBAAGj\r\ngZUwgZIwDAYDVR0TBAUwAwEB/zAdBgNVHQ4EFgQUtFrkpbPe0lL2udWmlQ/rPrzH\r\n/f8wYwYDVR0jBFwwWoAUtFrkpbPe0lL2udWmlQ/rPrzH/f+hP6Q9MDsxCzAJBgNV\r\nBAYTAk5MMREwDwYDVQQKEwhQb2xhclNTTDEZMBcGA1UEAxMQUG9sYXJTU0wgVGVz\r\ndCBDQYIBADANBgkqhkiG9w0BAQUFAAOCAQEAuP1U2ABUkIslsCfdlc2i94QHHYeJ\r\nSsR4EdgHtdciUI5I62J6Mom+Y0dT/7a+8S6MVMCZP6C5NyNyXw1GWY/YR82XTJ8H\r\nDBJiCTok5DbZ6SzaONBzdWHXwWwmi5vg1dxn7YxrM9d0IjxM27WNKs4sDQhZBQkF\r\npjmfs2cb4oPl4Y9T9meTx/lvdkRYEug61Jfn6cA+qHpyPYdTH+UshITnmp5/Ztkf\r\nm/UTSLBNFNHesiTZeH31NcxYGdHSme9Nc/gfidRa0FLOCfWxRlFqAI47zG9jAQCZ\r\n7Z2mCGDNMhjQc+BYcdnl0lPXjdDK6V0qCg1dVewhUBcW5gZKzV7e9+DpVA==\r\n-----END CERTIFICATE-----\r\n-----BEGIN CERTIFICATE-----\r\nMIICUjCCAdegAwIBAgIJAMFD4n5iQ8zoMAoGCCqGSM49BAMCMD4xCzAJBgNVBAYT\r\nAk5MMREwDwYDVQQKEwhQb2xhclNTTDEcMBoGA1UEAxMTUG9sYXJzc2wgVGVzdCBF\r\nQyBDQTAeFw0xMzA5MjQxNTQ5NDhaFw0yMzA5MjIxNTQ5NDhaMD4xCzAJBgNVBAYT\r\nAk5MMREwDwYDVQQKEwhQb2xhclNTTDEcMBoGA1UEAxMTUG9sYXJzc2wgVGVzdCBF\r\nQyBDQTB2MBAGByqGSM49AgEGBSuBBAAiA2IABMPaKzRBN1gvh1b+/Im6KUNLTuBu\r\nww5XUzM5WNRStJGVOQsj318XJGJI/BqVKc4sLYfCiFKAr9ZqqyHduNMcbli4yuiy\r\naY7zQa0pw7RfdadHb9UZKVVpmlM7ILRmFmAzHqOBoDCBnTAdBgNVHQ4EFgQUnW0g\r\nJEkBPyvLeLUZvH4kydv7NnwwbgYDVR0jBGcwZYAUnW0gJEkBPyvLeLUZvH4kydv7\r\nNnyhQqRAMD4xCzAJBgNVBAYTAk5MMREwDwYDVQQKEwhQb2xhclNTTDEcMBoGA1UE\r\nAxMTUG9sYXJzc2wgVGVzdCBFQyBDQYIJAMFD4n5iQ8zoMAwGA1UdEwQFMAMBAf8w\r\nCgYIKoZIzj0EAwIDaQAwZgIxAMO0YnNWKJUAfXgSJtJxexn4ipg+k..." /* TRUNCATED STRING LITERAL */
                         ,0x88d), uVar1 == 0)) {
    uVar1 = mbedtls_pk_parse_key(&pkey,(uchar *)mbedtls_test_srv_key,0x6ab,(uchar *)0x0,0);
    if (uVar1 == 0) {
      puts(" ok");
      printf("  . Bind on https://localhost:4433/ ...");
      fflush(_stdout);
      uVar1 = mbedtls_net_bind(&listen_fd,(char *)0x0,"4433",0);
      if (uVar1 == 0) {
        puts(" ok");
        printf("  . Seeding the random number generator...");
        fflush(_stdout);
        uVar1 = mbedtls_ctr_drbg_seed
                          (&ctr_drbg,mbedtls_entropy_func,&entropy,(uchar *)"ssl_server",10);
        if (uVar1 == 0) {
          puts(" ok");
          printf("  . Setting up the SSL data....");
          fflush(_stdout);
          uVar1 = mbedtls_ssl_config_defaults(&conf,1,0,0);
          if (uVar1 == 0) {
            mbedtls_ssl_conf_rng(&conf,mbedtls_ctr_drbg_random,&ctr_drbg);
            mbedtls_ssl_conf_dbg(&conf,my_debug,_stdout);
            mbedtls_ssl_conf_session_cache(&conf,&cache,mbedtls_ssl_cache_get,mbedtls_ssl_cache_set)
            ;
            mbedtls_ssl_conf_ca_chain(&conf,srvcert.next,(mbedtls_x509_crl *)0x0);
            uVar1 = mbedtls_ssl_conf_own_cert(&conf,&srvcert,&pkey);
            if (uVar1 == 0) {
              uVar1 = mbedtls_ssl_setup(&ssl,&conf);
              if (uVar1 == 0) {
                puts(" ok");
                do {
                  uStack_f90 = 0;
LAB_0010f84a:
                  if ((int)uStack_f90 != 0) {
                    mbedtls_strerror((int)uStack_f90,error_buf,100);
                    printf("Last error was: %d - %s\n\n",uStack_f90 & 0xffffffff,error_buf);
                  }
                  mbedtls_net_free(&client_fd);
                  mbedtls_ssl_session_reset(&ssl);
                  printf("  . Waiting for a remote connection ...");
                  fflush(_stdout);
                  uVar1 = mbedtls_net_accept(&listen_fd,&client_fd,(void *)0x0,0,(size_t *)0x0);
                  if (uVar1 != 0) {
                    uVar4 = (ulong)uVar1;
                    pcVar3 = " failed\n  ! mbedtls_net_accept returned %d\n\n";
                    goto LAB_0010f59d;
                  }
                  mbedtls_ssl_set_bio(&ssl,&client_fd,mbedtls_net_send,mbedtls_net_recv,
                                      (mbedtls_ssl_recv_timeout_t *)0x0);
                  puts(" ok");
                  printf("  . Performing the SSL/TLS handshake...");
                  fflush(_stdout);
LAB_0010f8fd:
                  uVar1 = mbedtls_ssl_handshake(&ssl);
                  if (uVar1 != 0) goto code_r0x0010f909;
                  puts(" ok");
                  printf("  < Read from client:");
                  fflush(_stdout);
                  do {
                    memset(buf,0,0x400);
                    uVar1 = mbedtls_ssl_read(&ssl,buf,0x3ff);
                  } while ((uVar1 & 0xffffff7f) == 0xffff9700);
                  if ((int)uVar1 < 1) {
                    if (uVar1 == 0xffffffb0) {
                      pcVar3 = " connection was reset by peer";
                    }
                    else {
                      if (uVar1 != 0xffff8780) {
                        printf(" mbedtls_ssl_read returned -0x%x\n",(ulong)-uVar1);
                        goto LAB_0010f9cc;
                      }
                      pcVar3 = " connection was closed gracefully";
                    }
                    puts(pcVar3);
                  }
                  else {
                    printf(" %d bytes read\n\n%s",(ulong)uVar1,buf);
                  }
LAB_0010f9cc:
                  printf("  > Write to client:");
                  fflush(_stdout);
                  pcVar3 = mbedtls_ssl_get_ciphersuite(&ssl);
                  iVar2 = sprintf((char *)buf,
                                  "HTTP/1.0 200 OK\r\nContent-Type: text/html\r\n\r\n<h2>mbed TLS Test Server</h2>\r\n<p>Successful connection using: %s</p>\r\n"
                                  ,pcVar3);
                  while( true ) {
                    uVar1 = mbedtls_ssl_write(&ssl,buf,(long)iVar2);
                    uVar4 = (ulong)uVar1;
                    if (0 < (int)uVar1) break;
                    if (uVar1 == 0xffffffb0) {
                      puts(" failed\n  ! peer closed the connection\n");
                      uStack_f90 = 0xffffffffffffffb0;
                      goto LAB_0010f84a;
                    }
                    if ((uVar1 & 0xffffff7f) != 0xffff9700) {
                      iVar2 = 0;
                      printf(" failed\n  ! mbedtls_ssl_write returned %d\n\n",(ulong)uVar1);
                      if (uVar1 == 0) goto LAB_0010f5d1;
                      goto LAB_0010f5a7;
                    }
                  }
                  printf(" %d bytes written\n\n%s\n",uVar4,buf);
                  printf("  . Closing the connection...");
                  while (uVar1 = mbedtls_ssl_close_notify(&ssl), (int)uVar1 < 0) {
                    if ((uVar1 & 0xffffff7f) != 0xffff9700) {
                      pcVar3 = " failed\n  ! mbedtls_ssl_close_notify returned %d\n\n";
                      goto LAB_0010f91f;
                    }
                  }
                  puts(" ok");
                } while( true );
              }
              uVar4 = (ulong)uVar1;
              pcVar3 = " failed\n  ! mbedtls_ssl_setup returned %d\n\n";
            }
            else {
              uVar4 = (ulong)uVar1;
              pcVar3 = " failed\n  ! mbedtls_ssl_conf_own_cert returned %d\n\n";
            }
          }
          else {
            uVar4 = (ulong)uVar1;
            pcVar3 = " failed\n  ! mbedtls_ssl_config_defaults returned %d\n\n";
          }
        }
        else {
          uVar4 = (ulong)uVar1;
          pcVar3 = " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n";
        }
      }
      else {
        uVar4 = (ulong)uVar1;
        pcVar3 = " failed\n  ! mbedtls_net_bind returned %d\n\n";
      }
    }
    else {
      uVar4 = (ulong)uVar1;
      pcVar3 = " failed\n  !  mbedtls_pk_parse_key returned %d\n\n";
    }
  }
  else {
    uVar4 = (ulong)uVar1;
    pcVar3 = " failed\n  !  mbedtls_x509_crt_parse returned %d\n\n";
  }
LAB_0010f59d:
  printf(pcVar3,uVar4);
LAB_0010f5a7:
  iVar2 = (int)uVar4;
  mbedtls_strerror(iVar2,error_buf,100);
  printf("Last error was: %d - %s\n\n",uVar4,error_buf);
LAB_0010f5d1:
  mbedtls_net_free(&client_fd);
  mbedtls_net_free(&listen_fd);
  mbedtls_x509_crt_free(&srvcert);
  mbedtls_pk_free(&pkey);
  mbedtls_ssl_free(&ssl);
  mbedtls_ssl_config_free(&conf);
  mbedtls_ssl_cache_free(&cache);
  mbedtls_ctr_drbg_free(&ctr_drbg);
  mbedtls_entropy_free(&entropy);
  return iVar2;
code_r0x0010f909:
  if ((uVar1 & 0xffffff7f) != 0xffff9700) goto code_r0x0010f918;
  goto LAB_0010f8fd;
code_r0x0010f918:
  pcVar3 = " failed\n  ! mbedtls_ssl_handshake returned %d\n\n";
LAB_0010f91f:
  uStack_f90 = (ulong)uVar1;
  printf(pcVar3,uStack_f90);
  goto LAB_0010f84a;
}

Assistant:

int main( void )
{
    int ret, len;
    mbedtls_net_context listen_fd, client_fd;
    unsigned char buf[1024];
    const char *pers = "ssl_server";

    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    mbedtls_ssl_context ssl;
    mbedtls_ssl_config conf;
    mbedtls_x509_crt srvcert;
    mbedtls_pk_context pkey;
#if defined(MBEDTLS_SSL_CACHE_C)
    mbedtls_ssl_cache_context cache;
#endif

    mbedtls_net_init( &listen_fd );
    mbedtls_net_init( &client_fd );
    mbedtls_ssl_init( &ssl );
    mbedtls_ssl_config_init( &conf );
#if defined(MBEDTLS_SSL_CACHE_C)
    mbedtls_ssl_cache_init( &cache );
#endif
    mbedtls_x509_crt_init( &srvcert );
    mbedtls_pk_init( &pkey );
    mbedtls_entropy_init( &entropy );
    mbedtls_ctr_drbg_init( &ctr_drbg );

#if defined(MBEDTLS_DEBUG_C)
    mbedtls_debug_set_threshold( DEBUG_LEVEL );
#endif

    /*
     * 1. Load the certificates and private RSA key
     */
    mbedtls_printf( "\n  . Loading the server cert. and key..." );
    fflush( stdout );

    /*
     * This demonstration program uses embedded test certificates.
     * Instead, you may want to use mbedtls_x509_crt_parse_file() to read the
     * server and CA certificates, as well as mbedtls_pk_parse_keyfile().
     */
    ret = mbedtls_x509_crt_parse( &srvcert, (const unsigned char *) mbedtls_test_srv_crt,
                          mbedtls_test_srv_crt_len );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  !  mbedtls_x509_crt_parse returned %d\n\n", ret );
        goto exit;
    }

    ret = mbedtls_x509_crt_parse( &srvcert, (const unsigned char *) mbedtls_test_cas_pem,
                          mbedtls_test_cas_pem_len );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  !  mbedtls_x509_crt_parse returned %d\n\n", ret );
        goto exit;
    }

    ret =  mbedtls_pk_parse_key( &pkey, (const unsigned char *) mbedtls_test_srv_key,
                         mbedtls_test_srv_key_len, NULL, 0 );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  !  mbedtls_pk_parse_key returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * 2. Setup the listening TCP socket
     */
    mbedtls_printf( "  . Bind on https://localhost:4433/ ..." );
    fflush( stdout );

    if( ( ret = mbedtls_net_bind( &listen_fd, NULL, "4433", MBEDTLS_NET_PROTO_TCP ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_bind returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * 3. Seed the RNG
     */
    mbedtls_printf( "  . Seeding the random number generator..." );
    fflush( stdout );

    if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                               (const unsigned char *) pers,
                               strlen( pers ) ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * 4. Setup stuff
     */
    mbedtls_printf( "  . Setting up the SSL data...." );
    fflush( stdout );

    if( ( ret = mbedtls_ssl_config_defaults( &conf,
                    MBEDTLS_SSL_IS_SERVER,
                    MBEDTLS_SSL_TRANSPORT_STREAM,
                    MBEDTLS_SSL_PRESET_DEFAULT ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ssl_config_defaults returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_ssl_conf_rng( &conf, mbedtls_ctr_drbg_random, &ctr_drbg );
    mbedtls_ssl_conf_dbg( &conf, my_debug, stdout );

#if defined(MBEDTLS_SSL_CACHE_C)
    mbedtls_ssl_conf_session_cache( &conf, &cache,
                                   mbedtls_ssl_cache_get,
                                   mbedtls_ssl_cache_set );
#endif

    mbedtls_ssl_conf_ca_chain( &conf, srvcert.next, NULL );
    if( ( ret = mbedtls_ssl_conf_own_cert( &conf, &srvcert, &pkey ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ssl_conf_own_cert returned %d\n\n", ret );
        goto exit;
    }

    if( ( ret = mbedtls_ssl_setup( &ssl, &conf ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ssl_setup returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

reset:
#ifdef MBEDTLS_ERROR_C
    if( ret != 0 )
    {
        char error_buf[100];
        mbedtls_strerror( ret, error_buf, 100 );
        mbedtls_printf("Last error was: %d - %s\n\n", ret, error_buf );
    }
#endif

    mbedtls_net_free( &client_fd );

    mbedtls_ssl_session_reset( &ssl );

    /*
     * 3. Wait until a client connects
     */
    mbedtls_printf( "  . Waiting for a remote connection ..." );
    fflush( stdout );

    if( ( ret = mbedtls_net_accept( &listen_fd, &client_fd,
                                    NULL, 0, NULL ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_accept returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_ssl_set_bio( &ssl, &client_fd, mbedtls_net_send, mbedtls_net_recv, NULL );

    mbedtls_printf( " ok\n" );

    /*
     * 5. Handshake
     */
    mbedtls_printf( "  . Performing the SSL/TLS handshake..." );
    fflush( stdout );

    while( ( ret = mbedtls_ssl_handshake( &ssl ) ) != 0 )
    {
        if( ret != MBEDTLS_ERR_SSL_WANT_READ && ret != MBEDTLS_ERR_SSL_WANT_WRITE )
        {
            mbedtls_printf( " failed\n  ! mbedtls_ssl_handshake returned %d\n\n", ret );
            goto reset;
        }
    }

    mbedtls_printf( " ok\n" );

    /*
     * 6. Read the HTTP Request
     */
    mbedtls_printf( "  < Read from client:" );
    fflush( stdout );

    do
    {
        len = sizeof( buf ) - 1;
        memset( buf, 0, sizeof( buf ) );
        ret = mbedtls_ssl_read( &ssl, buf, len );

        if( ret == MBEDTLS_ERR_SSL_WANT_READ || ret == MBEDTLS_ERR_SSL_WANT_WRITE )
            continue;

        if( ret <= 0 )
        {
            switch( ret )
            {
                case MBEDTLS_ERR_SSL_PEER_CLOSE_NOTIFY:
                    mbedtls_printf( " connection was closed gracefully\n" );
                    break;

                case MBEDTLS_ERR_NET_CONN_RESET:
                    mbedtls_printf( " connection was reset by peer\n" );
                    break;

                default:
                    mbedtls_printf( " mbedtls_ssl_read returned -0x%x\n", -ret );
                    break;
            }

            break;
        }

        len = ret;
        mbedtls_printf( " %d bytes read\n\n%s", len, (char *) buf );

        if( ret > 0 )
            break;
    }
    while( 1 );

    /*
     * 7. Write the 200 Response
     */
    mbedtls_printf( "  > Write to client:" );
    fflush( stdout );

    len = sprintf( (char *) buf, HTTP_RESPONSE,
                   mbedtls_ssl_get_ciphersuite( &ssl ) );

    while( ( ret = mbedtls_ssl_write( &ssl, buf, len ) ) <= 0 )
    {
        if( ret == MBEDTLS_ERR_NET_CONN_RESET )
        {
            mbedtls_printf( " failed\n  ! peer closed the connection\n\n" );
            goto reset;
        }

        if( ret != MBEDTLS_ERR_SSL_WANT_READ && ret != MBEDTLS_ERR_SSL_WANT_WRITE )
        {
            mbedtls_printf( " failed\n  ! mbedtls_ssl_write returned %d\n\n", ret );
            goto exit;
        }
    }

    len = ret;
    mbedtls_printf( " %d bytes written\n\n%s\n", len, (char *) buf );

    mbedtls_printf( "  . Closing the connection..." );

    while( ( ret = mbedtls_ssl_close_notify( &ssl ) ) < 0 )
    {
        if( ret != MBEDTLS_ERR_SSL_WANT_READ &&
            ret != MBEDTLS_ERR_SSL_WANT_WRITE )
        {
            mbedtls_printf( " failed\n  ! mbedtls_ssl_close_notify returned %d\n\n", ret );
            goto reset;
        }
    }

    mbedtls_printf( " ok\n" );

    ret = 0;
    goto reset;

exit:

#ifdef MBEDTLS_ERROR_C
    if( ret != 0 )
    {
        char error_buf[100];
        mbedtls_strerror( ret, error_buf, 100 );
        mbedtls_printf("Last error was: %d - %s\n\n", ret, error_buf );
    }
#endif

    mbedtls_net_free( &client_fd );
    mbedtls_net_free( &listen_fd );

    mbedtls_x509_crt_free( &srvcert );
    mbedtls_pk_free( &pkey );
    mbedtls_ssl_free( &ssl );
    mbedtls_ssl_config_free( &conf );
#if defined(MBEDTLS_SSL_CACHE_C)
    mbedtls_ssl_cache_free( &cache );
#endif
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

#if defined(_WIN32)
    mbedtls_printf( "  Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( ret );
}